

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utColladaExportLight.cpp
# Opt level: O3

void __thiscall
ColladaExportLight_testExportLight_Test::TestBody(ColladaExportLight_testExportLight_Test *this)

{
  pointer *ppbVar1;
  uint uVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> vVar3;
  undefined8 uVar4;
  aiVector2D aVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  aiLightSourceType aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  aiReturn aVar15;
  aiScene *paVar16;
  aiLight *expr1;
  aiScene *paVar17;
  ulong uVar18;
  aiLightSourceType *lhs;
  char *message;
  char *pcVar19;
  char *in_R9;
  aiLight *paVar20;
  aiLight **ppaVar21;
  aiLight *paVar22;
  bool bVar23;
  bool bVar24;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  uint origNumLights;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  origNames;
  undefined4 in_stack_ffffffffffffff5c;
  Message local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  abs_error;
  internal in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff79;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff80;
  undefined1 local_78 [20];
  uint local_64;
  AssertHelper local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  aiScene *local_40;
  aiScene *local_38;
  
  paVar16 = Assimp::Importer::ReadFile
                      ((this->super_ColladaExportLight).im,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/Collada/lights.dae"
                       ,0x400);
  ppbVar1 = &local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  vVar3 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
          (paVar16 != (aiScene *)0x0);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = vVar3;
  if (paVar16 == (aiScene *)0x0) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff78,(internal *)&local_58,
               (AssertionResult *)"pTest!=NULL","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
               ,0x4e,(char *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff58,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
    if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78) != local_78) {
      operator_delete((undefined1 *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
    }
    if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
        (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
       ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar23 = paVar16->mLights != (aiLight **)0x0;
    bVar24 = paVar16->mNumLights != 0;
    ppbVar1 = &local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_58.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar24 && bVar23);
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar24 && bVar23) {
      local_40 = (aiScene *)this;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_64 = paVar16->mNumLights;
      uVar18 = (ulong)local_64;
      expr1 = (aiLight *)operator_new__(uVar18 * 0x46c);
      if (uVar18 == 0) {
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        paVar22 = expr1 + uVar18;
        paVar20 = expr1;
        do {
          (expr1->mName).length = 0;
          (expr1->mName).data[0] = '\0';
          memset((expr1->mName).data + 1,0x1b,0x3ff);
          expr1->mType = aiLightSource_UNDEFINED;
          (expr1->mPosition).x = 0.0;
          (expr1->mPosition).y = 0.0;
          (expr1->mPosition).z = 0.0;
          (expr1->mDirection).x = 0.0;
          (expr1->mDirection).y = 0.0;
          *(undefined8 *)&(expr1->mDirection).z = 0;
          (expr1->mUp).x = 0.0;
          (expr1->mUp).y = 0.0;
          *(undefined8 *)&(expr1->mUp).z = 0;
          expr1->mAttenuationLinear = 1.0;
          expr1->mAttenuationQuadratic = 0.0;
          (expr1->mColorDiffuse).r = 0.0;
          (expr1->mColorDiffuse).g = 0.0;
          (expr1->mColorDiffuse).b = 0.0;
          (expr1->mColorSpecular).r = 0.0;
          (expr1->mColorSpecular).g = 0.0;
          *(undefined8 *)&(expr1->mColorSpecular).b = 0;
          (expr1->mColorAmbient).g = 0.0;
          (expr1->mColorAmbient).b = 0.0;
          expr1->mAngleInnerCone = 6.2831855;
          expr1->mAngleOuterCone = 6.2831855;
          (expr1->mSize).x = 0.0;
          (expr1->mSize).y = 0.0;
          expr1 = expr1 + 1;
        } while (expr1 != paVar22);
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expr1 = paVar20;
        if (uVar18 != 0) {
          ppaVar21 = paVar16->mLights;
          uVar18 = 0;
          local_38 = paVar16;
          do {
            std::__cxx11::string::string
                      ((string *)&stack0xffffffffffffff78,(ppaVar21[uVar18]->mName).data,
                       (allocator *)&local_98);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff78);
            if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78) !=
                local_78) {
              operator_delete((undefined1 *)
                              CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
            }
            ppaVar21 = paVar16->mLights;
            paVar22 = ppaVar21[uVar18];
            if (paVar20 != paVar22) {
              uVar2 = (paVar22->mName).length;
              (paVar20->mName).length = uVar2;
              memcpy((paVar20->mName).data,(paVar22->mName).data,(ulong)uVar2);
              (paVar20->mName).data[uVar2] = '\0';
              paVar16 = local_38;
            }
            paVar20->mAttenuationQuadratic = paVar22->mAttenuationQuadratic;
            aVar11 = paVar22->mType;
            fVar12 = (paVar22->mPosition).x;
            fVar13 = (paVar22->mPosition).y;
            fVar14 = (paVar22->mPosition).z;
            fVar9 = (paVar22->mDirection).x;
            fVar10 = (paVar22->mDirection).y;
            uVar4 = *(undefined8 *)&(paVar22->mDirection).z;
            fVar6 = (paVar22->mUp).z;
            fVar7 = paVar22->mAttenuationConstant;
            fVar8 = paVar22->mAttenuationLinear;
            (paVar20->mUp).y = (paVar22->mUp).y;
            (paVar20->mUp).z = fVar6;
            paVar20->mAttenuationConstant = fVar7;
            paVar20->mAttenuationLinear = fVar8;
            (paVar20->mDirection).x = fVar9;
            (paVar20->mDirection).y = fVar10;
            *(undefined8 *)&(paVar20->mDirection).z = uVar4;
            paVar20->mType = aVar11;
            (paVar20->mPosition).x = fVar12;
            (paVar20->mPosition).y = fVar13;
            (paVar20->mPosition).z = fVar14;
            (paVar20->mColorDiffuse).r = (paVar22->mColorDiffuse).r;
            (paVar20->mColorDiffuse).g = (paVar22->mColorDiffuse).g;
            (paVar20->mColorDiffuse).b = (paVar22->mColorDiffuse).b;
            (paVar20->mColorSpecular).r = (paVar22->mColorSpecular).r;
            (paVar20->mColorSpecular).g = (paVar22->mColorSpecular).g;
            (paVar20->mColorSpecular).b = (paVar22->mColorSpecular).b;
            (paVar20->mColorAmbient).r = (paVar22->mColorAmbient).r;
            (paVar20->mColorAmbient).g = (paVar22->mColorAmbient).g;
            (paVar20->mColorAmbient).b = (paVar22->mColorAmbient).b;
            fVar6 = paVar22->mAngleOuterCone;
            aVar5 = paVar22->mSize;
            paVar20->mAngleInnerCone = paVar22->mAngleInnerCone;
            paVar20->mAngleOuterCone = fVar6;
            paVar20->mSize = aVar5;
            uVar18 = uVar18 + 1;
            paVar20 = paVar20 + 1;
          } while (uVar18 < local_64);
        }
      }
      paVar17 = local_40;
      local_98.ss_.ptr_._0_4_ = 0;
      pcVar19 = (char *)0x0;
      aVar15 = Assimp::Exporter::Export
                         (*(Exporter **)&local_40->mNumMeshes,paVar16,"collada","lightsExp.dae",0,
                          (ExportProperties *)0x0);
      testing::internal::CmpHelperEQ<aiReturn,aiReturn>
                ((internal *)&stack0xffffffffffffff78,"aiReturn_SUCCESS",
                 "ex->Export(pTest,\"collada\",file)",(aiReturn *)&local_98,
                 (aiReturn *)&stack0xffffffffffffff58);
      if (in_stack_ffffffffffffff78 == (internal)0x0) {
        testing::Message::Message(&local_98);
        if (in_stack_ffffffffffffff80.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x59,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
        if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
            (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
           ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffff80,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      paVar16 = Assimp::Importer::ReadFile((Importer *)paVar17->mMeshes,"lightsExp.dae",0x400);
      local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,paVar16 != (aiScene *)0x0);
      if (paVar16 == (aiScene *)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&stack0xffffffffffffff78,(internal *)&local_98,
                   (AssertionResult *)"imported!=NULL","false","true",pcVar19);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x5d,(char *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff58);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78) != local_78)
        {
          operator_delete((undefined1 *)
                          CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
        }
        if (((CONCAT44(in_stack_ffffffffffffff5c,aVar15) != 0) &&
            (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
           ((long *)CONCAT44(in_stack_ffffffffffffff5c,aVar15) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,aVar15) + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff70,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff70,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar23 = paVar16->mLights != (aiLight **)0x0;
        bVar24 = paVar16->mNumLights != 0;
        local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,bVar24 && bVar23);
        abs_error.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar24 || !bVar23) {
          testing::Message::Message((Message *)&stack0xffffffffffffff58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&stack0xffffffffffffff78,(internal *)&local_98,
                     (AssertionResult *)"imported->HasLights()","false","true",pcVar19);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x5f,(char *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffff58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78) !=
              local_78) {
            operator_delete((undefined1 *)
                            CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
          }
          if (((CONCAT44(in_stack_ffffffffffffff5c,aVar15) != 0) &&
              (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
             ((long *)CONCAT44(in_stack_ffffffffffffff5c,aVar15) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,aVar15) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff70,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&stack0xffffffffffffff78,"origNumLights","imported->mNumLights",
                   &local_64,&paVar16->mNumLights);
        if (in_stack_ffffffffffffff78 == (internal)0x0) {
          testing::Message::Message(&local_98);
          if (in_stack_ffffffffffffff80.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x60,pcVar19);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
          if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
              (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
             ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff80,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_64 != 0) {
          lhs = &expr1->mType;
          paVar17 = (aiScene *)&DAT_00000008;
          uVar18 = 0;
          local_40 = paVar16;
          do {
            paVar20 = paVar16->mLights[uVar18];
            local_98.ss_.ptr_._0_4_ = 0;
            local_38 = paVar17;
            aVar15 = strncmp(*(char **)(local_58.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].field_2.
                                        _M_local_buf + 8 + (long)paVar17),(paVar20->mName).data,
                             *(size_t *)
                              ((long)&paVar17->mFlags +
                              (long)&(local_58.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus));
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&stack0xffffffffffffff78,"0",
                       "strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() )"
                       ,(int *)&local_98,(int *)&stack0xffffffffffffff58);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,100,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                      ((internal *)&stack0xffffffffffffff78,"orig->mType","read->mType",lhs,
                       &paVar20->mType);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x65,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mAttenuationConstant",
                       "read->mAttenuationConstant",(float)lhs[10],paVar20->mAttenuationConstant);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x66,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mAttenuationLinear",
                       "read->mAttenuationLinear",(float)lhs[0xb],paVar20->mAttenuationLinear);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x67,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::DoubleNearPredFormat
                      ((char *)expr1,(char *)CONCAT44(in_stack_ffffffffffffff5c,aVar15),
                       (char *)0x3705dc,(double)in_stack_ffffffffffffff80.ptr_,
                       (double)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
                       (double)abs_error.ptr_);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x68,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorAmbient.r",
                       "read->mColorAmbient.r",((aiColor3D *)(lhs + 0x13))->r,
                       (paVar20->mColorAmbient).r);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6a,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorAmbient.g",
                       "read->mColorAmbient.g",(float)lhs[0x14],(paVar20->mColorAmbient).g);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6b,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorAmbient.b",
                       "read->mColorAmbient.b",(float)lhs[0x15],(paVar20->mColorAmbient).b);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6c,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorDiffuse.r",
                       "read->mColorDiffuse.r",((aiColor3D *)(lhs + 0xd))->r,
                       (paVar20->mColorDiffuse).r);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6e,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorDiffuse.g",
                       "read->mColorDiffuse.g",(float)lhs[0xe],(paVar20->mColorDiffuse).g);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6f,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorDiffuse.b",
                       "read->mColorDiffuse.b",(float)lhs[0xf],(paVar20->mColorDiffuse).b);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x70,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorSpecular.r",
                       "read->mColorSpecular.r",((aiColor3D *)(lhs + 0x10))->r,
                       (paVar20->mColorSpecular).r);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x72,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorSpecular.g",
                       "read->mColorSpecular.g",(float)lhs[0x11],(paVar20->mColorSpecular).g);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x73,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff78,"orig->mColorSpecular.b",
                       "read->mColorSpecular.b",(float)lhs[0x12],(paVar20->mColorSpecular).b);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x74,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::DoubleNearPredFormat
                      ((char *)expr1,(char *)CONCAT44(in_stack_ffffffffffffff5c,aVar15),
                       (char *)0x370c63,(double)in_stack_ffffffffffffff80.ptr_,
                       (double)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
                       (double)abs_error.ptr_);
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x76,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::DoubleNearPredFormat
                      ((char *)expr1,(char *)CONCAT44(in_stack_ffffffffffffff5c,aVar15),
                       (char *)0x370d1d,(double)in_stack_ffffffffffffff80.ptr_,
                       (double)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
                       (double)abs_error.ptr_);
            paVar16 = local_40;
            if (in_stack_ffffffffffffff78 == (internal)0x0) {
              testing::Message::Message(&local_98);
              pcVar19 = "";
              if (in_stack_ffffffffffffff80.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff80.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x77,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
                  (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
                 ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff80,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar18 = uVar18 + 1;
            lhs = lhs + 0x11b;
            paVar17 = (aiScene *)&local_38->mNumMaterials;
          } while (uVar18 < local_64);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      operator_delete__(expr1);
    }
    else {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&stack0xffffffffffffff78,(internal *)&local_58,
                 (AssertionResult *)"pTest->HasLights()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                 ,0x4f,(char *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78));
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff58,&local_98)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
      if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78) != local_78) {
        operator_delete((undefined1 *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))
        ;
      }
      if (((CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) &&
          (bVar23 = testing::internal::IsTrue(true), bVar23)) &&
         ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST_F(ColladaExportLight, testExportLight)
{
    const char* file = "lightsExp.dae";

    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/Collada/lights.dae", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest!=NULL);
    ASSERT_TRUE(pTest->HasLights());

    const unsigned int origNumLights( pTest->mNumLights );
    std::unique_ptr<aiLight[]> origLights( new aiLight[ origNumLights ] );
    std::vector<std::string> origNames;
    for (size_t i = 0; i < origNumLights; i++) {
        origNames.push_back( pTest->mLights[ i ]->mName.C_Str() );
        origLights[ i ] = *(pTest->mLights[ i ]);
    }

    EXPECT_EQ(AI_SUCCESS,ex->Export(pTest,"collada",file));

    const aiScene* imported = im->ReadFile(file, aiProcess_ValidateDataStructure);

    ASSERT_TRUE(imported!=NULL);

    EXPECT_TRUE(imported->HasLights());
    EXPECT_EQ( origNumLights,imported->mNumLights );
    for(size_t i=0; i< origNumLights; i++) {
        const aiLight *orig = &origLights[ i ];
        const aiLight *read = imported->mLights[i];
        EXPECT_EQ( 0,strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() ) );
        EXPECT_EQ( orig->mType,read->mType);
        EXPECT_FLOAT_EQ(orig->mAttenuationConstant,read->mAttenuationConstant);
        EXPECT_FLOAT_EQ(orig->mAttenuationLinear,read->mAttenuationLinear);
        EXPECT_NEAR(orig->mAttenuationQuadratic,read->mAttenuationQuadratic, 0.001f);

        EXPECT_FLOAT_EQ(orig->mColorAmbient.r,read->mColorAmbient.r);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.g,read->mColorAmbient.g);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.b,read->mColorAmbient.b);

        EXPECT_FLOAT_EQ(orig->mColorDiffuse.r,read->mColorDiffuse.r);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.g,read->mColorDiffuse.g);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.b,read->mColorDiffuse.b);

        EXPECT_FLOAT_EQ(orig->mColorSpecular.r,read->mColorSpecular.r);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.g,read->mColorSpecular.g);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.b,read->mColorSpecular.b);

        EXPECT_NEAR(orig->mAngleInnerCone,read->mAngleInnerCone,0.001);
        EXPECT_NEAR(orig->mAngleOuterCone,read->mAngleOuterCone,0.001);
    }
}